

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O0

void __thiscall
baryonyx::itm::
solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
::solver_inequalities_101coeff
          (solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  type pbVar6;
  int *piVar7;
  debug_logger<true> *in_stack_00000198;
  undefined1 in_stack_000001a0 [16];
  int local_84;
  reference local_80;
  function_element *cst;
  const_iterator __end4;
  const_iterator __begin4;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *__range4;
  int upper;
  int lower;
  int e;
  int i;
  int id;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *local_30;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *csts_local;
  cost_type *c__local;
  int n__local;
  int m__local;
  random_engine *rng__local;
  solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  *this_local;
  
  local_30 = csts;
  csts_local = (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)c_;
  c__local._0_4_ = n_;
  c__local._4_4_ = m_;
  _n__local = rng_;
  rng__local = (random_engine *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"solver_inequalities_101coeff");
  debug_logger<true>::debug_logger(in_stack_00000198,(string_view)in_stack_000001a0);
  this->rng = _n__local;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>
            (&this->ap,local_30,c__local._4_4_,(int)c__local);
  sparse_matrix<int>::size(&this->ap);
  std::make_unique<long_double[]>((size_t)&this->P);
  sVar4 = sparse_matrix<int>::size(&this->ap);
  value_bit_array<-1,_1>::value_bit_array(&this->A,(int)sVar4);
  compute_reduced_costs_vector_size(local_30);
  std::
  make_unique<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>
            ((size_t)&this->R);
  std::
  make_unique<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::bound_factor[]>
            ((size_t)&this->b);
  std::make_unique<long_double[]>((size_t)&this->pi);
  this->c = (cost_type *)csts_local;
  this->m = c__local._4_4_;
  this->n = (int)c__local;
  e = 0;
  lower = 0;
  upper = length<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                    (local_30);
  while( true ) {
    if (lower == upper) {
      return;
    }
    __range4._4_4_ = 0;
    __range4._0_4_ = 0;
    pvVar5 = std::
             vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ::operator[](local_30,(long)lower);
    __end4 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
             begin(&pvVar5->elements);
    cst = (function_element *)
          std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::end
                    (&pvVar5->elements);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                        (&__end4,(__normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                                  *)&cst);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_80 = __gnu_cxx::
                 __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                 ::operator*(&__end4);
      iVar3 = e;
      iVar2 = local_80->factor;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      if (iVar2 != 1) {
        details::fail_fast("Postcondition","std::abs(cst.factor) == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-101.cpp"
                           ,"104");
      }
      if (local_80->factor < 1) {
        e = e + 1;
        bit_array_impl::unset(&(this->A).super_bit_array_impl,iVar3);
      }
      else {
        e = e + 1;
        bit_array_impl::set(&(this->A).super_bit_array_impl,iVar3);
      }
      if (local_80->factor < 1) {
        __range4._4_4_ = __range4._4_4_ + 1;
      }
      else {
        __range4._0_4_ = (int)__range4 + 1;
      }
      __gnu_cxx::
      __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
      ::operator++(&__end4);
    }
    pvVar5 = std::
             vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ::operator[](local_30,(long)lower);
    iVar2 = pvVar5->min;
    pvVar5 = std::
             vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ::operator[](local_30,(long)lower);
    if (iVar2 == pvVar5->max) {
      pvVar5 = std::
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               ::operator[](local_30,(long)lower);
      iVar2 = pvVar5->min;
      pbVar6 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[]>_>
               ::operator[](&this->b,(long)lower);
      pbVar6->min = iVar2;
      pvVar5 = std::
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               ::operator[](local_30,(long)lower);
      iVar2 = pvVar5->max;
      pbVar6 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[]>_>
               ::operator[](&this->b,(long)lower);
      pbVar6->max = iVar2;
    }
    else {
      local_84 = -__range4._4_4_;
      pvVar5 = std::
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               ::operator[](local_30,(long)lower);
      piVar7 = std::max<int>(&local_84,&pvVar5->min);
      iVar2 = *piVar7;
      pbVar6 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[]>_>
               ::operator[](&this->b,(long)lower);
      pbVar6->min = iVar2;
      pvVar5 = std::
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               ::operator[](local_30,(long)lower);
      piVar7 = std::min<int>((int *)&__range4,&pvVar5->max);
      iVar2 = *piVar7;
      pbVar6 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[]>_>
               ::operator[](&this->b,(long)lower);
      pbVar6->max = iVar2;
    }
    iVar2 = __range4._4_4_;
    pbVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[]>_>
             ::operator[](&this->b,(long)lower);
    pbVar6->negative_factor = iVar2;
    pbVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[]>_>
             ::operator[](&this->b,(long)lower);
    iVar2 = pbVar6->min;
    pbVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[]>_>
             ::operator[](&this->b,(long)lower);
    if (pbVar6->max < iVar2) break;
    iVar2 = (int)__range4 + __range4._4_4_;
    pvVar5 = std::
             vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ::operator[](local_30,(long)lower);
    iVar3 = length<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
                      (&pvVar5->elements);
    if (iVar2 != iVar3) {
      details::fail_fast("Postcondition","upper + lower == length(csts[i].elements)",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-101.cpp"
                         ,"128");
    }
    lower = lower + 1;
  }
  details::fail_fast("Postcondition","b[i].min <= b[i].max",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-101.cpp"
                     ,"127");
}

Assistant:

solver_inequalities_101coeff(random_engine& rng_,
                                 int m_,
                                 int n_,
                                 const cost_type& c_,
                                 const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_101coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(static_cast<int>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);

                if (cst.factor > 0)
                    A.set(id++);
                else
                    A.unset(id++);

                if (cst.factor > 0)
                    upper++;
                else
                    lower++;
            }

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                b[i].min = std::max(-lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            b[i].negative_factor = lower;

            bx_ensures(b[i].min <= b[i].max);
            bx_ensures(upper + lower == length(csts[i].elements));
        }
    }